

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getCompileMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar1;
  StringPtr version;
  StringPtr briefDescription;
  MainBuilder builder;
  
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1e;
  version.content.ptr = "Cap\'n Proto version (unknown)";
  briefDescription.content.size_ = 100;
  briefDescription.content.ptr =
       "Compiles Cap\'n Proto schema files and generates corresponding source code in one or more languages."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  addCompileOptions(in_RSI,&builder);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&builder);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

kj::MainFunc getCompileMain() {
    kj::MainBuilder builder(context, VERSION_STRING,
          "Compiles Cap'n Proto schema files and generates corresponding source code in one or "
          "more languages.");
    addGlobalOptions(builder);
    addCompileOptions(builder);
    return builder.build();
  }